

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav__seek_from_start(ma_dr_wav_seek_proc onSeek,ma_uint64 offset,void *pUserData)

{
  ma_bool32 mVar1;
  ma_dr_wav_seek_origin mVar2;
  
  mVar2 = ma_dr_wav_seek_origin_start;
  if (offset >> 0x1f != 0) {
    mVar1 = (*onSeek)(pUserData,0x7fffffff,ma_dr_wav_seek_origin_start);
    if (mVar1 != 0) {
      offset = offset - 0x7fffffff;
      mVar2 = ma_dr_wav_seek_origin_current;
      do {
        if (offset < 0x80000000) goto LAB_00182cbf;
        mVar1 = (*onSeek)(pUserData,0x7fffffff,ma_dr_wav_seek_origin_current);
        offset = offset - 0x7fffffff;
      } while (mVar1 != 0);
    }
    return 0;
  }
LAB_00182cbf:
  mVar1 = (*onSeek)(pUserData,(int)offset,mVar2);
  return mVar1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__seek_from_start(ma_dr_wav_seek_proc onSeek, ma_uint64 offset, void* pUserData)
{
    if (offset <= 0x7FFFFFFF) {
        return onSeek(pUserData, (int)offset, ma_dr_wav_seek_origin_start);
    }
    if (!onSeek(pUserData, 0x7FFFFFFF, ma_dr_wav_seek_origin_start)) {
        return MA_FALSE;
    }
    offset -= 0x7FFFFFFF;
    for (;;) {
        if (offset <= 0x7FFFFFFF) {
            return onSeek(pUserData, (int)offset, ma_dr_wav_seek_origin_current);
        }
        if (!onSeek(pUserData, 0x7FFFFFFF, ma_dr_wav_seek_origin_current)) {
            return MA_FALSE;
        }
        offset -= 0x7FFFFFFF;
    }
}